

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GPUShaderFP64Test10::iterate(GPUShaderFP64Test10 *this)

{
  functionEnum function_00;
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  reference pfVar2;
  reference type_00;
  TestContext *pTVar3;
  __normal_iterator<gl4cts::GPUShaderFP64Test10::functionEnum_*,_std::vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>_>
  local_80;
  __normal_iterator<gl4cts::GPUShaderFP64Test10::functionEnum_*,_std::vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>_>
  local_78;
  __normal_iterator<const_gl4cts::GPUShaderFP64Test10::functionEnum_*,_std::vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>_>
  local_70;
  const_iterator function;
  __normal_iterator<gl4cts::GPUShaderFP64Test10::typeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>_>
  local_60;
  __normal_iterator<const_gl4cts::GPUShaderFP64Test10::typeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>_>
  local_58;
  const_iterator type;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  GPUShaderFP64Test10 *pGStack_10;
  bool result;
  GPUShaderFP64Test10 *this_local;
  
  local_11 = 1;
  pGStack_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    type._M_current._3_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_gpu_shader_fp64 is not supported",&local_39);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
    type._M_current._3_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  testInit(this);
  local_60._M_current =
       (typeDetails *)
       std::
       vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
       ::begin(&this->m_types);
  __gnu_cxx::
  __normal_iterator<gl4cts::GPUShaderFP64Test10::typeDetails_const*,std::vector<gl4cts::GPUShaderFP64Test10::typeDetails,std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>>>
  ::__normal_iterator<gl4cts::GPUShaderFP64Test10::typeDetails*>
            ((__normal_iterator<gl4cts::GPUShaderFP64Test10::typeDetails_const*,std::vector<gl4cts::GPUShaderFP64Test10::typeDetails,std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>>>
              *)&local_58,&local_60);
  while( true ) {
    function._M_current =
         (functionEnum *)
         std::
         vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
         ::end(&this->m_types);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<gl4cts::GPUShaderFP64Test10::typeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>_>
                        *)&function,&local_58);
    if (!bVar1) break;
    local_78._M_current =
         (functionEnum *)
         std::
         vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ::begin(&this->m_functions);
    __gnu_cxx::
    __normal_iterator<gl4cts::GPUShaderFP64Test10::functionEnum_const*,std::vector<gl4cts::GPUShaderFP64Test10::functionEnum,std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>>>
    ::__normal_iterator<gl4cts::GPUShaderFP64Test10::functionEnum*>
              ((__normal_iterator<gl4cts::GPUShaderFP64Test10::functionEnum_const*,std::vector<gl4cts::GPUShaderFP64Test10::functionEnum,std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>>>
                *)&local_70,&local_78);
    while( true ) {
      local_80._M_current =
           (functionEnum *)
           std::
           vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
           ::end(&this->m_functions);
      bVar1 = __gnu_cxx::operator!=(&local_80,&local_70);
      if (!bVar1) break;
      pfVar2 = __gnu_cxx::
               __normal_iterator<const_gl4cts::GPUShaderFP64Test10::functionEnum_*,_std::vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>_>
               ::operator*(&local_70);
      function_00 = *pfVar2;
      type_00 = __gnu_cxx::
                __normal_iterator<const_gl4cts::GPUShaderFP64Test10::typeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>_>
                ::operator*(&local_58);
      bVar1 = test(this,function_00,type_00);
      if (!bVar1) {
        local_11 = 0;
      }
      __gnu_cxx::
      __normal_iterator<const_gl4cts::GPUShaderFP64Test10::functionEnum_*,_std::vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>_>
      ::operator++(&local_70);
    }
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test10::typeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>_>
    ::operator++(&local_58);
  }
  if ((local_11 & 1) == 1) {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test10::iterate()
{
	bool result = true;

	/* Check if extension is supported */
	if (false == m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported");
	}

	testInit();

	/* For each combination of function and type */
	for (std::vector<typeDetails>::const_iterator type = m_types.begin(); m_types.end() != type; ++type)
	{
		for (std::vector<functionEnum>::const_iterator function = m_functions.begin(); m_functions.end() != function;
			 ++function)
		{
			if (false == test(*function, *type))
			{
				result = false;
			}
		}
	}

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}